

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRightCircularCone::IfcRightCircularCone(IfcRightCircularCone *this)

{
  *(undefined ***)&this->field_0x58 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcRightCircularCone";
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__007d2020);
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x40 = 0;
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7d1f68;
  *(undefined8 *)&this->field_0x58 = 0x7d2008;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7d1f90;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7d1fb8;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0x7d1fe0;
  return;
}

Assistant:

IfcRightCircularCone() : Object("IfcRightCircularCone") {}